

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_BlockAppendFrame
                (matroska_block *Block,matroska_frame *Frame,mkv_timestamp_t ClusterTimestamp)

{
  mkv_timestamp_t ClusterTimestamp_local;
  matroska_frame *Frame_local;
  matroska_block *Block_local;
  
  if (((Block->Base).Base.bValueIsSet == '\0') && (Frame->Timestamp != 0x7fffffffffffffff)) {
    MATROSKA_BlockSetTimestamp(Block,Frame->Timestamp,ClusterTimestamp);
  }
  ArrayAppend(&Block->Data,Frame->Data,(ulong)Frame->Size,0);
  ArrayAppend(&Block->Durations,&Frame->Duration,8,0);
  ArrayAppend(&Block->SizeList,&Frame->Size,4,0);
  (Block->Base).Base.bValueIsSet = '\x01';
  (Block->Base).Base.bNeedDataSizeUpdate = '\x01';
  Block->Lacing = '\x04';
  return 0;
}

Assistant:

err_t MATROSKA_BlockAppendFrame(matroska_block *Block, const matroska_frame *Frame, mkv_timestamp_t ClusterTimestamp)
{
    if (!Block->Base.Base.bValueIsSet && Frame->Timestamp!=INVALID_TIMESTAMP_T)
        MATROSKA_BlockSetTimestamp(Block,Frame->Timestamp,ClusterTimestamp);
    ArrayAppend(&Block->Data,Frame->Data,Frame->Size,0);
    ArrayAppend(&Block->Durations,&Frame->Duration,sizeof(Frame->Duration),0);
    ArrayAppend(&Block->SizeList,&Frame->Size,sizeof(Frame->Size),0);
    Block->Base.Base.bValueIsSet = 1;
    Block->Base.Base.bNeedDataSizeUpdate = 1;
    Block->Lacing = LACING_AUTO;
    return ERR_NONE;
}